

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O0

void jsonnet_json_destroy(JsonnetVm *vm,JsonnetJsonValue *v)

{
  JsonnetJsonValue *in_RSI;
  
  if (in_RSI != (JsonnetJsonValue *)0x0) {
    JsonnetJsonValue::~JsonnetJsonValue(in_RSI);
    operator_delete(in_RSI,0x78);
  }
  return;
}

Assistant:

void jsonnet_json_destroy(JsonnetVm *vm, JsonnetJsonValue *v)
{
    (void)vm;
    delete v;
}